

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

void __thiscall CSubNet::CSubNet(CSubNet *this,CNetAddr *addr,CNetAddr *mask)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  value_type_conflict *__src;
  uint pos;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  size_t x;
  int num_bits;
  uchar b;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *__range1;
  bool zeros_found;
  const_iterator __end1;
  const_iterator __begin1;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  const_iterator in_stack_ffffffffffffff38;
  bool local_72;
  ulong local_60;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CSubNet((CSubNet *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  bVar2 = CNetAddr::IsIPv4((CNetAddr *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                          );
  if (!bVar2) {
    bVar2 = CNetAddr::IsIPv6((CNetAddr *)
                             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    local_72 = false;
    if (!bVar2) goto LAB_00e02564;
  }
  local_72 = *(int *)(in_RSI + 0x18) == *(int *)(in_RDX + 0x18);
LAB_00e02564:
  *(bool *)(in_RDI + 0x30) = local_72;
  if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
    bVar2 = false;
    prevector<16U,_unsigned_char,_unsigned_int,_int>::begin
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    prevector<16U,_unsigned_char,_unsigned_int,_int>::end
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    while (bVar3 = prevector<16U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator!=
                             ((const_iterator *)
                              CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                              in_stack_ffffffffffffff38), bVar3) {
      prevector<16U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator*
                ((const_iterator *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      iVar4 = NetmaskBits((uint8_t)((uint)in_stack_ffffffffffffff28 >> 0x18));
      if ((iVar4 == -1) || ((bVar2 && (iVar4 != 0)))) {
        *(undefined1 *)(in_RDI + 0x30) = 0;
        goto LAB_00e027df;
      }
      if (iVar4 < 8) {
        bVar2 = true;
      }
      prevector<16U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator++
                ((const_iterator *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    }
    sVar5 = prevector<16U,_unsigned_char,_unsigned_int,_int>::size
                      ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                       in_stack_ffffffffffffff38.ptr);
    if (0x10 < sVar5) {
      __assert_fail("mask.m_addr.size() <= sizeof(netmask)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.cpp"
                    ,0x3d6,"CSubNet::CSubNet(const CNetAddr &, const CNetAddr &)");
    }
    __src = prevector<16U,_unsigned_char,_unsigned_int,_int>::data
                      ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                       CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    sVar5 = prevector<16U,_unsigned_char,_unsigned_int,_int>::size
                      ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                       in_stack_ffffffffffffff38.ptr);
    memcpy((void *)(in_RDI + 0x20),__src,(ulong)sVar5);
    CNetAddr::operator=((CNetAddr *)in_stack_ffffffffffffff38.ptr,
                        (CNetAddr *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    for (local_60 = 0;
        sVar5 = prevector<16U,_unsigned_char,_unsigned_int,_int>::size
                          ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                           in_stack_ffffffffffffff38.ptr), local_60 < sVar5; local_60 = local_60 + 1
        ) {
      pos = (uint)*(byte *)(in_RDI + 0x20 + local_60);
      in_stack_ffffffffffffff38.ptr =
           prevector<16U,_unsigned_char,_unsigned_int,_int>::operator[]
                     (in_stack_ffffffffffffff38.ptr,pos);
      (((CNetAddr *)in_stack_ffffffffffffff38.ptr)->m_addr)._union.direct[0] =
           (((CNetAddr *)in_stack_ffffffffffffff38.ptr)->m_addr)._union.direct[0] & (byte)pos;
    }
  }
LAB_00e027df:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

CSubNet::CSubNet(const CNetAddr& addr, const CNetAddr& mask) : CSubNet()
{
    valid = (addr.IsIPv4() || addr.IsIPv6()) && addr.m_net == mask.m_net;
    if (!valid) {
        return;
    }
    // Check if `mask` contains 1-bits after 0-bits (which is an invalid netmask).
    bool zeros_found = false;
    for (auto b : mask.m_addr) {
        const int num_bits = NetmaskBits(b);
        if (num_bits == -1 || (zeros_found && num_bits != 0)) {
            valid = false;
            return;
        }
        if (num_bits < 8) {
            zeros_found = true;
        }
    }

    assert(mask.m_addr.size() <= sizeof(netmask));

    memcpy(netmask, mask.m_addr.data(), mask.m_addr.size());

    network = addr;

    // Normalize network according to netmask
    for (size_t x = 0; x < network.m_addr.size(); ++x) {
        network.m_addr[x] &= netmask[x];
    }
}